

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O0

int bin_mdef_phone_id_nearest(bin_mdef_t *m,int32 b,int32 l,int32 r,int32 pos)

{
  int iVar1;
  int local_38;
  int local_34;
  int newr;
  int newl;
  int tmppos;
  int p;
  int32 pos_local;
  int32 r_local;
  int32 l_local;
  int32 b_local;
  bin_mdef_t *m_local;
  
  m_local._4_4_ = b;
  if (((-1 < l) && (-1 < r)) && (m_local._4_4_ = bin_mdef_phone_id(m,b,l,r,pos), m_local._4_4_ < 0))
  {
    for (newr = 0; newr < 4; newr = newr + 1) {
      if ((newr != pos) && (iVar1 = bin_mdef_phone_id(m,b,l,r,newr), -1 < iVar1)) {
        return iVar1;
      }
    }
    m_local._4_4_ = b;
    if (-1 < m->sil) {
      if (((m->phone[l].info.ci.filler != '\0') || (pos == 1)) || (local_34 = l, pos == 3)) {
        local_34 = m->sil;
      }
      if (((m->phone[r].info.ci.filler != '\0') || (pos == 2)) || (local_38 = r, pos == 3)) {
        local_38 = m->sil;
      }
      if (((local_34 != l) || (local_38 != r)) &&
         (m_local._4_4_ = bin_mdef_phone_id(m,b,local_34,local_38,pos), m_local._4_4_ < 0)) {
        newr = 0;
        while ((m_local._4_4_ = b, newr < 4 &&
               ((newr == pos ||
                (m_local._4_4_ = bin_mdef_phone_id(m,b,local_34,local_38,newr), m_local._4_4_ < 0)))
               )) {
          newr = newr + 1;
        }
      }
    }
  }
  return m_local._4_4_;
}

Assistant:

int
bin_mdef_phone_id_nearest(bin_mdef_t * m, int32 b, int32 l, int32 r, int32 pos)
{
    int p, tmppos;



    /* In the future, we might back off when context is not available,
     * but for now we'll just return the CI phone. */
    if (l < 0 || r < 0)
        return b;

    p = bin_mdef_phone_id(m, b, l, r, pos);
    if (p >= 0)
        return p;

    /* Exact triphone not found; backoff to other word positions */
    for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
        if (tmppos != pos) {
            p = bin_mdef_phone_id(m, b, l, r, tmppos);
            if (p >= 0)
                return p;
        }
    }

    /* Nothing yet; backoff to silence phone if non-silence filler context */
    /* In addition, backoff to silence phone on left/right if in beginning/end position */
    if (m->sil >= 0) {
        int newl = l, newr = r;
        if (m->phone[(int)l].info.ci.filler
            || pos == WORD_POSN_BEGIN || pos == WORD_POSN_SINGLE)
            newl = m->sil;
        if (m->phone[(int)r].info.ci.filler
            || pos == WORD_POSN_END || pos == WORD_POSN_SINGLE)
            newr = m->sil;
        if ((newl != l) || (newr != r)) {
            p = bin_mdef_phone_id(m, b, newl, newr, pos);
            if (p >= 0)
                return p;

            for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
                if (tmppos != pos) {
                    p = bin_mdef_phone_id(m, b, newl, newr, tmppos);
                    if (p >= 0)
                        return p;
                }
            }
        }
    }

    /* Nothing yet; backoff to base phone */
    return b;
}